

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O3

int __thiscall
soplex::CLUFactorRational::solveLleft(CLUFactorRational *this,Rational *vec,int *nonz,int rn)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  pointer v;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *pcVar10;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *o;
  type t;
  Rational y;
  Rational x;
  uint local_168;
  uint local_164;
  longlong local_160;
  int *local_158;
  ulong local_150;
  expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_148;
  char local_133;
  char local_132;
  uint local_128;
  void *local_120;
  char local_113;
  char local_112;
  data_type local_108;
  undefined4 local_f8;
  undefined2 local_f4;
  char local_f2;
  data_type local_e8;
  undefined4 local_d8;
  undefined2 local_d4;
  char local_d2;
  int *local_c8;
  int *local_c0;
  Rational *local_b8;
  ulong local_b0;
  data_type local_a8;
  undefined4 local_98;
  undefined2 local_94;
  char local_92;
  data_type local_88;
  undefined4 local_78;
  undefined2 local_74;
  char local_72;
  CLUFactorRational *local_60;
  int *local_58;
  int *local_50;
  int *local_48;
  long local_40;
  int *local_38;
  
  iVar1 = 0;
  local_a8.la[0] = 0;
  local_98 = 1;
  local_94 = 0x100;
  local_92 = '\0';
  local_88.la[0] = 1;
  local_78 = 1;
  local_74 = 0x100;
  local_72 = '\0';
  local_108.la[0] = 0;
  local_f8 = 1;
  local_f4 = 0x100;
  local_f2 = '\0';
  local_e8.la[0] = 1;
  local_d8 = 1;
  local_d4 = 0x100;
  local_d2 = '\0';
  local_164 = rn;
  local_b8 = vec;
  if (0 < rn) {
    local_58 = (this->l).ridx;
    local_50 = (this->l).rbeg;
    local_48 = (this->l).rorig;
    local_c0 = (this->l).rperm;
    uVar4 = 0;
    do {
      iVar1 = local_c0[nonz[uVar4]];
      if (uVar4 == 0) {
        lVar7 = 0;
      }
      else {
        uVar8 = uVar4 & 0xffffffff;
        do {
          uVar9 = (uint)uVar8 - 1;
          uVar6 = uVar9 >> 1;
          uVar3 = (uint)uVar8;
          if (iVar1 <= nonz[uVar6]) break;
          nonz[uVar8] = nonz[uVar6];
          uVar8 = (ulong)uVar6;
          uVar3 = uVar6;
        } while (1 < uVar9);
        lVar7 = (long)(int)uVar3;
      }
      uVar4 = uVar4 + 1;
      nonz[lVar7] = iVar1;
    } while (uVar4 != (uint)rn);
    if (rn < 1) {
      iVar1 = 0;
    }
    else {
      local_158 = nonz + this->thedim;
      local_150 = 0;
      local_c8 = nonz;
      local_60 = this;
      do {
        iVar1 = deQueueMaxRat(nonz,(int *)&local_164);
        iVar1 = local_48[iVar1];
        pcVar10 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   *)(local_b8 + iVar1);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_a8.ld,pcVar10);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_88.ld,pcVar10 + 1);
        local_160 = 0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_148,&local_160,(type *)0x0);
        iVar2 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_a8.ld,
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_148);
        if ((local_113 == '\0') && (local_112 == '\0')) {
          operator_delete(local_120,(ulong)local_128 << 3);
        }
        if ((local_133 == '\0') && (local_132 == '\0')) {
          operator_delete(local_148.arg2,((ulong)local_148.arg1 & 0xffffffff) << 3);
        }
        if (iVar2 == 0) {
          local_148.arg1 = (pointer)0x0;
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
          ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                       *)pcVar10,(longlong *)&local_148);
        }
        else {
          local_158[-1] = iVar1;
          iVar2 = local_50[iVar1];
          local_168 = local_164;
          uVar3 = local_50[(long)iVar1 + 1] - iVar2;
          if (uVar3 != 0 && iVar2 <= local_50[(long)iVar1 + 1]) {
            piVar5 = local_58 + iVar2;
            v = (local_60->l).rval.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar2;
            local_b0 = (ulong)uVar3;
            do {
              local_40 = (long)*piVar5;
              o = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   *)(local_b8 + local_40);
              local_38 = piVar5;
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_108.ld,o);
              pcVar10 = o + 1;
              boost::multiprecision::backends::
              cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        *)&local_e8.ld,pcVar10);
              local_160 = 0;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor<long_long>
                        ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_148,&local_160,(type *)0x0);
              iVar1 = boost::multiprecision::backends::
                      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                 *)&local_108.ld,
                                (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                 *)&local_148);
              if ((local_113 == '\0') && (local_112 == '\0')) {
                operator_delete(local_120,(ulong)local_128 << 3);
              }
              if ((local_133 == '\0') && (local_132 == '\0')) {
                operator_delete(local_148.arg2,((ulong)local_148.arg1 & 0xffffffff) << 3);
              }
              if (iVar1 == 0) {
                local_148.arg2 = (type)&local_a8;
                local_148.arg1 = v;
                boost::multiprecision::
                number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                ::
                do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>>
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                            *)&local_108.ld,&local_148,(multiply_immediates *)&local_160);
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::negate((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                          *)&local_108.ld);
                local_160 = 0;
                boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::rational_adaptor<long_long>
                          ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_148,&local_160,(type *)0x0);
                iVar1 = boost::multiprecision::backends::
                        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                   *)&local_108.ld,
                                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                   *)&local_148);
                if ((local_113 == '\0') && (local_112 == '\0')) {
                  operator_delete(local_120,(ulong)local_128 << 3);
                }
                if ((local_133 == '\0') && (local_132 == '\0')) {
                  operator_delete(local_148.arg2,((ulong)local_148.arg1 & 0xffffffff) << 3);
                }
                if (iVar1 != 0) {
                  boost::multiprecision::backends::
                  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  ::assign(o,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                              *)&local_108.ld);
                  boost::multiprecision::backends::
                  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  ::assign(pcVar10,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                    *)&local_e8.ld);
                  iVar1 = local_c0[local_40];
                  uVar3 = local_168;
                  if (0 < (int)local_168) {
                    do {
                      uVar6 = uVar3 - 1;
                      uVar9 = uVar6 >> 1;
                      if (iVar1 <= local_c8[uVar9]) break;
                      local_c8[uVar3] = local_c8[uVar9];
                      uVar3 = uVar9;
                    } while (1 < uVar6);
                  }
                  local_168 = local_168 + 1;
                  local_c8[(int)uVar3] = iVar1;
                }
              }
              else {
                boost::multiprecision::default_ops::
                eval_multiply_subtract<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                          ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_108.ld,
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_a8.ld,&v->m_backend);
                boost::multiprecision::backends::
                cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                ::assign(o,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            *)&local_108.ld);
                boost::multiprecision::backends::
                cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                ::assign(pcVar10,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                  *)&local_e8.ld);
              }
              iVar1 = (int)local_b0;
              local_b0 = (ulong)(iVar1 - 1);
              piVar5 = local_38 + 1;
              v = v + 1;
            } while (1 < iVar1);
          }
          local_158 = local_158 + -1;
          local_150 = (ulong)((int)local_150 + 1);
          local_164 = local_168;
          nonz = local_c8;
        }
      } while (0 < (int)local_164);
      iVar1 = (int)local_150;
      if (0 < iVar1) {
        lVar7 = 0;
        do {
          nonz[lVar7] = local_158[lVar7];
          lVar7 = lVar7 + 1;
        } while (iVar1 != (int)lVar7);
      }
    }
  }
  if ((local_d4._1_1_ == '\0') && (local_d2 == '\0')) {
    operator_delete(local_e8.ld.data,(local_e8.la[0] & 0xffffffff) << 3);
  }
  if ((local_f4._1_1_ == '\0') && (local_f2 == '\0')) {
    operator_delete(local_108.ld.data,(local_108.la[0] & 0xffffffff) << 3);
  }
  if ((local_74._1_1_ == '\0') && (local_72 == '\0')) {
    operator_delete(local_88.ld.data,(local_88.la[0] & 0xffffffff) << 3);
  }
  if ((local_94._1_1_ == '\0') && (local_92 == '\0')) {
    operator_delete(local_a8.ld.data,(local_a8.la[0] & 0xffffffff) << 3);
  }
  return iVar1;
}

Assistant:

inline int CLUFactorRational::solveLleft(Rational* vec, int* nonz, int rn)
{
   int i, j, k, n;
   int r;
   Rational x, y;
   Rational* val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig, *rperm;
   int* last;

   ridx  = l.ridx;
   VectorRational& rval  = l.rval;
   rbeg  = l.rbeg;
   rorig = l.rorig;
   rperm = l.rperm;
   n     = 0;

   i = l.firstUpdate - 1;
#ifndef SOPLEX_WITH_L_ROWS
#pragma warn "Not yet implemented, define SOPLEX_WITH_L_ROWS"
   VectorRational& lval = l.val;
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   for(; i >= 0; --i)
   {
      k   = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x   = 0;

      for(j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   /*  move rhsidx to a heap
    */
   for(i = 0; i < rn;)
      enQueueMaxRat(nonz, &i, rperm[nonz[i]]);

   last = nonz + thedim;

   while(rn > 0)
   {
      i = deQueueMaxRat(nonz, &rn);
      r = rorig[i];
      x = vec[r];

      if(x != 0)
      {
         *(--last) = r;
         n++;
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            int m = *idx++;
            y = vec[m];

            if(y == 0)
            {
               y = -x * *val++;

               if(y != 0)
               {
                  vec[m] = y;
                  enQueueMaxRat(nonz, &rn, rperm[m]);
               }
            }
            else
            {
               y -= x * *val++;
               //               vec[m] = ( y != 0 ) ? y : SOPLEX_MARKER;
               vec[m] = y;
            }
         }
      }
      else
         vec[r] = 0;
   }

   for(i = 0; i < n; ++i)
      *nonz++ = *last++;

#endif

   return n;
}